

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdFreeSplitTxOutHandle(void *handle,void *split_output_handle)

{
  undefined8 *puVar1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string local_40;
  
  cfd::Initialize();
  if (split_output_handle != (void *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SplitTxOut","");
    cfd::capi::CheckBuffer(split_output_handle,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    puVar1 = *(undefined8 **)((long)split_output_handle + 0x18);
    if (puVar1 != (undefined8 *)0x0) {
      if ((void *)*puVar1 != (void *)0x0) {
        operator_delete((void *)*puVar1);
      }
      operator_delete(puVar1);
      *(undefined8 *)((long)split_output_handle + 0x18) = 0;
    }
    this = *(vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> **)
            ((long)split_output_handle + 0x20);
    if (this != (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)0x0) {
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)split_output_handle + 0x20) = 0;
    }
    this_00 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                **)((long)split_output_handle + 0x28);
    if (this_00 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      operator_delete(this_00);
      *(undefined8 *)((long)split_output_handle + 0x28) = 0;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SplitTxOut","");
  cfd::capi::FreeBuffer(split_output_handle,&local_40,0x30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdFreeSplitTxOutHandle(void* handle, void* split_output_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (split_output_handle != nullptr) {
      CheckBuffer(split_output_handle, kPrefixSplitTxOut);
      CfdCapiSplitTxOutData* data =
          static_cast<CfdCapiSplitTxOutData*>(split_output_handle);
      if (data->amount_list != nullptr) {
        delete data->amount_list;
        data->amount_list = nullptr;
      }
      if (data->locking_script_list != nullptr) {
        delete data->locking_script_list;
        data->locking_script_list = nullptr;
      }
      if (data->nonce_list != nullptr) {
        delete data->nonce_list;
        data->nonce_list = nullptr;
      }
    }
    FreeBuffer(
        split_output_handle, kPrefixSplitTxOut, sizeof(CfdCapiSplitTxOutData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}